

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult __thiscall
testing::internal::CmpHelperEQ<pbrt::Vector2<float>,pbrt::Vector2<float>>
          (internal *this,char *expected_expression,char *actual_expression,Vector2<float> *expected
          ,Vector2<float> *actual)

{
  undefined8 uVar1;
  Vector2<float> *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  AssertionResult AVar5;
  string local_60;
  string local_40;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = expected->super_Tuple2<pbrt::Vector2,_float>;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = actual->super_Tuple2<pbrt::Vector2,_float>;
  uVar1 = vcmpps_avx512vl(auVar3,auVar4,0);
  if ((~(ushort)uVar1 & 3) == 0) {
    AVar5 = AssertionSuccess();
    sVar2 = AVar5.message_.ptr_;
  }
  else {
    PrintToString<pbrt::Vector2<float>>
              (&local_40,(testing *)expected,(Vector2<float> *)actual_expression);
    PrintToString<pbrt::Vector2<float>>(&local_60,(testing *)actual,value);
    AVar5 = EqFailure(this,expected_expression,actual_expression,&local_40,&local_60,false);
    sVar2 = AVar5.message_.ptr_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      sVar2.ptr_ = extraout_RDX;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      sVar2.ptr_ = extraout_RDX_00;
    }
  }
  AVar5.message_.ptr_ = sVar2.ptr_;
  AVar5._0_8_ = this;
  return AVar5;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}